

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

double __thiscall slang::SVInt::trunc(SVInt *this,double __x)

{
  byte bVar1;
  SVInt *pSVar2;
  uint in_EDX;
  ulong uVar3;
  ulong *src;
  SVInt *pSVar4;
  ulong *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  SVInt local_30;
  
  bVar1 = *(byte *)((long)in_RSI + 0xd);
  if ((uint)in_RSI[1] < 0x41 && (bVar1 & 1) == 0) {
    uVar3 = ~(-1L << ((byte)in_EDX & 0x3f));
    if (in_EDX == 0x40) {
      uVar3 = 0xffffffffffffffff;
    }
    SVInt(this,in_EDX,uVar3 & *in_RSI,*(bool *)((long)in_RSI + 0xc));
    dVar5 = extraout_XMM0_Qa;
  }
  else {
    (this->super_SVIntStorage).field_0.val = 0;
    (this->super_SVIntStorage).bitWidth = 1;
    (this->super_SVIntStorage).signFlag = false;
    (this->super_SVIntStorage).unknownFlag = false;
    if (in_EDX < 0x41 && (bVar1 & 1) == 0) {
      SVInt(&local_30,in_EDX,0,*(bool *)((long)in_RSI + 0xc));
    }
    else {
      allocZeroed(&local_30,in_EDX,*(bool *)((long)in_RSI + 0xc),(bool)(bVar1 & 1));
    }
    operator=(this,&local_30);
    ~SVInt(&local_30);
    pSVar2 = (SVInt *)(this->super_SVIntStorage).field_0.pVal;
    pSVar4 = this;
    if (((this->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar4 = pSVar2;
    }
    if (0x40 < (this->super_SVIntStorage).bitWidth) {
      pSVar4 = pSVar2;
    }
    src = in_RSI;
    if ((*(byte *)((long)in_RSI + 0xd) & 1) != 0) {
      src = (ulong *)*in_RSI;
    }
    if (0x40 < (uint)in_RSI[1]) {
      src = (ulong *)*in_RSI;
    }
    bitcpy((uint64_t *)pSVar4,0,src,in_EDX,0);
    if (*(char *)((long)in_RSI + 0xd) == '\x01') {
      pSVar2 = (SVInt *)(this->super_SVIntStorage).field_0.val;
      pSVar4 = this;
      if (((this->super_SVIntStorage).unknownFlag & 1U) != 0) {
        pSVar4 = pSVar2;
      }
      if (0x40 < (this->super_SVIntStorage).bitWidth) {
        pSVar4 = pSVar2;
      }
      bitcpy(&(&(pSVar4->super_SVIntStorage).field_0)[in_EDX + 0x3f >> 6].val,0,
             (uint64_t *)((ulong)((int)in_RSI[1] + 0x3fU >> 6) * 8 + *in_RSI),in_EDX,0);
    }
    clearUnusedBits(this);
    checkUnknown(this);
    dVar5 = extraout_XMM0_Qa_00;
  }
  return dVar5;
}

Assistant:

SVInt SVInt::trunc(bitwidth_t bits) const {
    SLANG_ASSERT(bits > 0 && bits <= bitWidth);

    if (isSingleWord()) {
        uint64_t mask = bits == 64 ? UINT64_MAX : (1ull << bits) - 1;
        return SVInt(bits, val & mask, signFlag);
    }

    SVInt result;
    if (bits > 64 || unknownFlag)
        result = SVInt::allocZeroed(bits, signFlag, unknownFlag);
    else
        result = SVInt(bits, 0, signFlag);

    bitcpy(result.getRawData(), 0, getRawData(), bits, 0);

    if (unknownFlag) {
        // copy over preexisting unknown data
        uint32_t words = getNumWords(bits, false);
        bitcpy(result.getRawData() + words, 0, pVal + getNumWords() / 2, bits, 0);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}